

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort.cpp
# Opt level: O3

void merge_2way(uchar **from0,size_t n0,uchar **from1,size_t n1,uchar **result)

{
  int iVar1;
  uchar *__s1;
  uchar **__src;
  char *pcVar2;
  size_t sVar3;
  uchar *__s2;
  uchar **local_38;
  
  if (n0 == 0) {
    pcVar2 = "n0";
  }
  else {
    if (n1 != 0) {
      if (result == (uchar **)0x0) {
        __assert_fail("result",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                      ,0x47,
                      "void merge_2way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                     );
      }
      __s1 = *from0;
      if (__s1 == (uchar *)0x0) {
        pcVar2 = "key0";
      }
      else {
        __s2 = *from1;
        local_38 = from0;
        if (__s2 != (uchar *)0x0) {
          do {
            if (__s2 == (uchar *)0x0) {
              __assert_fail("b != 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                            ,0x33,"int cmp(const unsigned char *, const unsigned char *)");
            }
            iVar1 = strcmp((char *)__s1,(char *)__s2);
            if (iVar1 < 1) {
              *result = __s1;
              n0 = n0 - 1;
              __src = from1;
              sVar3 = n1;
              if (n0 == 0) {
LAB_001c011b:
                memcpy(result + 1,__src,sVar3 << 3);
                return;
              }
              __s1 = local_38[1];
              local_38 = local_38 + 1;
            }
            else {
              *result = __s2;
              n1 = n1 - 1;
              __src = local_38;
              sVar3 = n0;
              if (n1 == 0) goto LAB_001c011b;
              __s2 = from1[1];
              from1 = from1 + 1;
            }
            result = result + 1;
            if (__s1 == (uchar *)0x0) {
              __assert_fail("a != 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                            ,0x32,"int cmp(const unsigned char *, const unsigned char *)");
            }
          } while( true );
        }
        pcVar2 = "key1";
      }
      __assert_fail(pcVar2,
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                    ,0x48,
                    "void merge_2way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                   );
    }
    pcVar2 = "n1";
  }
  __assert_fail(pcVar2,
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                ,0x46,
                "void merge_2way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
               );
}

Assistant:

static void
merge_2way(unsigned char** restrict from0, size_t n0,
           unsigned char** restrict from1, size_t n1,
           unsigned char** restrict result)
{
	debug()<<__func__<<"(), n0="<<n0<<", n1="<<n1<<"\n";
	unsigned char* key0 = *from0;
	unsigned char* key1 = *from1;
	assert(n0); assert(n1);
	assert(from0); assert(from1); assert(result);
	assert(key0); assert(key1);
	while (true) {
		if (cmp(key0, key1) <= 0) {
			*result++ = key0;
			if (--n0 == 0) goto finish0;
			++from0;
			key0 = *from0;
		} else {
			*result++ = key1;
			if (--n1 == 0) goto finish1;
			++from1;
			key1 = *from1;
		}
	}
finish0:
	assert(n0 == 0);
	assert(n1 > 0);
	debug()<<__func__<<"(), n0="<<n0<<", n1="<<n1<<"\n";
	(void) memcpy(result, from1, n1*sizeof(unsigned char*));
	return;
finish1:
	assert(n1 == 0);
	assert(n0 > 0);
	debug()<<__func__<<"(), n0="<<n0<<", n1="<<n1<<"\n";
	(void) memcpy(result, from0, n0*sizeof(unsigned char*));
	return;
}